

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

TPZGeoEl * __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoPoint>::CreateBCGeoBlendEl
          (TPZGeoElRefLess<pzgeom::TPZGeoPoint> *this,int side,int bc)

{
  TPZGeoMesh *pTVar1;
  MElementType MVar2;
  int iVar3;
  long lVar4;
  undefined4 extraout_var;
  TPZGeoElSide me;
  int64_t index;
  TPZManVector<long,_10> nodeindices;
  TPZGeoElSide newelside;
  TPZGeoElSide local_d0;
  undefined1 local_b8 [8];
  TPZManVector<long,_10> local_b0;
  TPZGeoElSide local_40;
  TPZGeoEl *pTVar5;
  
  TPZManVector<long,_10>::TPZManVector(&local_b0,1);
  lVar4 = (**(code **)(*(long *)&this->super_TPZGeoEl + 0x128))(this,side,0);
  *local_b0.super_TPZVec<long>.fStore = lVar4;
  pTVar1 = (this->super_TPZGeoEl).fMesh;
  MVar2 = pztopology::TPZPoint::Type(side);
  iVar3 = (*(pTVar1->super_TPZSavable)._vptr_TPZSavable[0xd])
                    (pTVar1,(ulong)MVar2,&local_b0,(ulong)(uint)bc,local_b8);
  pTVar5 = (TPZGeoEl *)CONCAT44(extraout_var,iVar3);
  local_d0.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
  local_d0.fGeoEl = &this->super_TPZGeoEl;
  local_d0.fSide = side;
  local_40.fSide = (**(code **)(*(long *)pTVar5 + 0xf0))(pTVar5);
  local_40.fSide = local_40.fSide + -1;
  local_40.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
  local_40.fGeoEl = pTVar5;
  TPZGeoElSide::InsertConnectivity(&local_40,&local_d0);
  (**(code **)(*(long *)pTVar5 + 0x78))(pTVar5);
  TPZManVector<long,_10>::~TPZManVector(&local_b0);
  return pTVar5;
}

Assistant:

TPZGeoEl *TPZGeoElRefLess<TGeo>::CreateBCGeoBlendEl(int side,int bc)
{
	int sidennodes = TGeo::NSideNodes(side);
	TPZManVector<int64_t> nodeindices(sidennodes);
	int inode;
	for(inode=0; inode<sidennodes; inode++){
		nodeindices[inode] = this->SideNodeIndex(side,inode);
	}
	int64_t index;
	
	TPZGeoMesh *mesh = this->Mesh();
	MElementType BCtype = TGeo::Type(side);
	
	TPZGeoEl *newel = mesh->CreateGeoBlendElement(BCtype, nodeindices, bc, index);
	TPZGeoElSide me(this,side);
	TPZGeoElSide newelside(newel,newel->NSides()-1);
	
	newelside.InsertConnectivity(me);
	newel->Initialize();
	
	return newel;
}